

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O1

StructMappingInfo *
duckdb::AddFieldToStruct
          (StructMappingInfo *__return_storage_ptr__,LogicalType *type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_path,ColumnDefinition *new_field,idx_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  LogicalType *pLVar8;
  undefined8 uVar9;
  bool bVar10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  string *psVar11;
  const_reference pvVar12;
  LogicalType *pLVar13;
  ParsedExpression *pPVar14;
  undefined1 auVar15 [8];
  BinderException *pBVar16;
  pointer ppVar17;
  bool bVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  child_list_t<LogicalType> child_list;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_348;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_340;
  pointer local_338;
  pointer ppStack_330;
  pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  pointer local_318;
  undefined1 local_308 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2a0 [56];
  undefined1 local_268 [8];
  _Alloc_hider local_260;
  char acStack_258 [8];
  char local_250 [16];
  string local_240 [16];
  char local_230 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_220 [56];
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  idx_t local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_1c0;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  Value local_170;
  exception local_130 [16];
  LogicalType local_120;
  string local_108;
  string local_e8;
  child_list_t<LogicalType> local_c8;
  child_list_t<LogicalType> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (type->id_ != STRUCT) {
    pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
    local_308._0_8_ = local_308 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,
               "Column %s is not a struct - ALTER TABLE can only add fields to structs","");
    pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](column_path,depth);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (pvVar12->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + pvVar12->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar16,(string *)local_308,&local_50);
    __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LogicalType::LogicalType((LogicalType *)local_308);
  local_308._24_8_ = (ConstantExpression *)0x0;
  ErrorData::ErrorData((ErrorData *)(local_308 + 0x20));
  __x = &StructType::GetChildTypes_abi_cxx11_(type)->
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_338,__x);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(depth + 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)(column_path->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(column_path->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) == paVar1) {
    local_318 = ppStack_330;
    if (local_338 != ppStack_330) {
      paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
      local_320 = &(__return_storage_ptr__->error).final_message.field_2;
      local_1e8 = (element_type *)&(__return_storage_ptr__->error).extra_info;
      ppVar17 = local_338;
      do {
        psVar11 = ColumnDefinition::Name_abi_cxx11_(new_field);
        bVar10 = StringUtil::CIEquals(&ppVar17->first,psVar11);
        if (bVar10) {
          local_170.type_._0_8_ = (long)&local_170 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,
                     "Duplicate field \"%s\" - field already exists in struct %s","");
          psVar11 = ColumnDefinition::Name_abi_cxx11_(new_field);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          pcVar2 = (psVar11->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,pcVar2,pcVar2 + psVar11->_M_string_length);
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::back(column_path);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          pcVar2 = (pvVar12->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,pcVar2,pcVar2 + pvVar12->_M_string_length);
          CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                    ((CatalogException *)local_130,(string *)&local_170,&local_1b0,&local_190);
          ErrorData::ErrorData((ErrorData *)local_268,local_130);
          local_308._32_2_ = local_268._0_2_;
          ::std::__cxx11::string::operator=((string *)&local_2e0,(string *)&local_260);
          ::std::__cxx11::string::operator=((string *)&local_2c0,local_240);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign(local_2a0,local_220);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(local_220);
          if ((char *)local_240._0_8_ != local_230) {
            operator_delete((void *)local_240._0_8_);
          }
          if (local_260._M_p != local_250) {
            operator_delete(local_260._M_p);
          }
          ::std::runtime_error::~runtime_error((runtime_error *)local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_170.type_._0_8_ !=
              (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_170 + 0x10U)) {
            operator_delete((void *)local_170.type_._0_8_);
          }
          LogicalType::LogicalType(&__return_storage_ptr__->new_type,(LogicalType *)local_308);
          (__return_storage_ptr__->default_value).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)local_308._24_8_;
          local_308._24_8_ = (ConstantExpression *)0x0;
          (__return_storage_ptr__->error).initialized = (bool)local_308[0x20];
          (__return_storage_ptr__->error).type = local_308[0x21];
          (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
          if (local_2e0 == &local_2d0) {
            *(undefined4 *)paVar1 = local_2d0._M_allocated_capacity._0_4_;
            *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
                 local_2d0._M_allocated_capacity._4_4_;
            *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
                 local_2d0._8_4_;
            *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
                 local_2d0._12_4_;
          }
          else {
            (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_2e0;
            (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
                 CONCAT44(local_2d0._M_allocated_capacity._4_4_,
                          local_2d0._M_allocated_capacity._0_4_);
          }
          (__return_storage_ptr__->error).raw_message._M_string_length = local_2d8;
          local_2d8 = 0;
          local_2d0._M_allocated_capacity._0_4_ = local_2d0._M_allocated_capacity._0_4_ & 0xffffff00
          ;
          (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_320;
          if (local_2c0 == &local_2b0) {
            *(undefined4 *)local_320 = local_2b0._M_allocated_capacity._0_4_;
            *(undefined4 *)((long)local_320 + 4) = local_2b0._M_allocated_capacity._4_4_;
            *(undefined4 *)((long)local_320 + 8) = local_2b0._8_4_;
            *(undefined4 *)((long)local_320 + 0xc) = local_2b0._12_4_;
          }
          else {
            (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_2c0;
            (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
                 CONCAT44(local_2b0._M_allocated_capacity._4_4_,
                          local_2b0._M_allocated_capacity._0_4_);
          }
          (__return_storage_ptr__->error).final_message._M_string_length = local_2b8;
          local_2b8 = 0;
          local_2b0._M_allocated_capacity._0_4_ = local_2b0._M_allocated_capacity._0_4_ & 0xffffff00
          ;
          local_2e0 = &local_2d0;
          local_2c0 = &local_2b0;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_1e8,local_2a0);
          if (bVar10) goto LAB_00a9cb8b;
        }
        ppVar17 = ppVar17 + 1;
      } while (ppVar17 != local_318);
    }
    psVar11 = ColumnDefinition::Name_abi_cxx11_(new_field);
    pLVar13 = ColumnDefinition::Type(new_field);
    ::std::
    vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
    ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType_const&>
              ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                *)&local_338,psVar11,pLVar13);
    local_a8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_338;
    local_a8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppStack_330;
    local_a8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_328;
    local_338 = (pointer)0x0;
    ppStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    LogicalType::STRUCT((LogicalType *)local_268,&local_a8);
    local_308._0_2_ = local_268._0_2_;
    LogicalType::~LogicalType((LogicalType *)local_268);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_a8);
    bVar10 = ColumnDefinition::HasDefaultValue(new_field);
    if (bVar10) {
      pPVar14 = ColumnDefinition::DefaultValue(new_field);
      (*(pPVar14->super_BaseExpression)._vptr_BaseExpression[0xc])(local_268,pPVar14);
      auVar15 = local_268;
    }
    else {
      pLVar13 = ColumnDefinition::Type(new_field);
      LogicalType::LogicalType(&local_120,pLVar13);
      Value::Value(&local_170,&local_120);
      auVar15 = (undefined1  [8])operator_new(0x78);
      Value::Value((Value *)local_268,&local_170);
      ConstantExpression::ConstantExpression((ConstantExpression *)auVar15,(Value *)local_268);
      Value::~Value((Value *)local_268);
      Value::~Value(&local_170);
      LogicalType::~LogicalType(&local_120);
    }
    local_340._M_head_impl = (ParsedExpression *)auVar15;
    psVar11 = ColumnDefinition::Name_abi_cxx11_(new_field);
    pcVar2 = (psVar11->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar2,pcVar2 + psVar11->_M_string_length);
    PackExpression((duckdb *)local_268,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_340,&local_e8);
    auVar15 = local_268;
    uVar9 = local_308._24_8_;
    local_268 = (undefined1  [8])0x0;
    local_308._24_8_ = auVar15;
    if ((ConstantExpression *)uVar9 != (ConstantExpression *)0x0) {
      (**(code **)(*(long *)uVar9 + 8))();
    }
    local_268 = (undefined1  [8])0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((ConstantExpression *)local_340._M_head_impl != (ConstantExpression *)0x0) {
      (*((BaseExpression *)&((local_340._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_340._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::LogicalType(&__return_storage_ptr__->new_type,(LogicalType *)local_308);
    (__return_storage_ptr__->default_value).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)local_308._24_8_;
  }
  else {
    local_1d8 = depth;
    local_318 = (pointer)vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[](column_path,(size_type)paVar1);
    ppVar17 = ppStack_330;
    if (local_338 == ppStack_330) {
      bVar10 = true;
      bVar18 = false;
    }
    else {
      local_1b8 = &(__return_storage_ptr__->new_type).type_info_;
      local_1c0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&(__return_storage_ptr__->error).extra_info;
      local_1c8 = &(__return_storage_ptr__->error).final_message.field_2;
      local_1d0 = &(__return_storage_ptr__->error).raw_message.field_2;
      bVar18 = false;
      pLVar13 = &local_338->second;
      local_320 = paVar1;
      do {
        bVar10 = StringUtil::CIEquals
                           ((string *)
                            &pLVar13[-2].type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,&local_318->first);
        iVar19 = 0;
        if (bVar10) {
          AddFieldToStruct(__return_storage_ptr__,pLVar13,column_path,new_field,(idx_t)local_320);
          bVar10 = (__return_storage_ptr__->error).initialized;
          iVar19 = 1;
          if (bVar10 == false) {
            pLVar13->id_ = (__return_storage_ptr__->new_type).id_;
            pLVar13->physical_type_ = (__return_storage_ptr__->new_type).physical_type_;
            uVar20 = *(undefined4 *)
                      &(pLVar13->type_info_).internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar21 = *(undefined4 *)
                      ((long)&(pLVar13->type_info_).internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 4);
            peVar7 = (pLVar13->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar22 = *(undefined4 *)
                      &(pLVar13->type_info_).internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
            uVar23 = *(undefined4 *)
                      ((long)&(pLVar13->type_info_).internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4);
            (pLVar13->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pLVar13->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            peVar5 = (__return_storage_ptr__->new_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var6 = (__return_storage_ptr__->new_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (local_1b8->internal).
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (local_1b8->internal).
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (pLVar13->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (pLVar13->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
            (pLVar13->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var6;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_1e8 = peVar7;
              uStack_1e0 = uVar22;
              uStack_1dc = uVar23;
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              uVar20 = (undefined4)local_1e8;
              uVar21 = local_1e8._4_4_;
              uVar22 = uStack_1e0;
              uVar23 = uStack_1dc;
            }
            p_Var3 = (__return_storage_ptr__->new_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            *(undefined4 *)
             &(__return_storage_ptr__->new_type).type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar20;
            *(undefined4 *)
             ((long)&(__return_storage_ptr__->new_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             4) = uVar21;
            *(undefined4 *)
             &(__return_storage_ptr__->new_type).type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = uVar22;
            *(undefined4 *)
             ((long)&(__return_storage_ptr__->new_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = uVar23;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            local_348._M_head_impl =
                 (__return_storage_ptr__->default_value).
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (__return_storage_ptr__->default_value).
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)0x0;
            p_Var3 = pLVar13[-2].type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_108,p_Var3,
                       (long)&p_Var3->_vptr__Sp_counted_base + *(long *)(pLVar13 + -1));
            PackExpression((duckdb *)local_268,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&local_348,&local_108);
            auVar15 = local_268;
            uVar9 = local_308._24_8_;
            local_268 = (undefined1  [8])0x0;
            local_308._24_8_ = auVar15;
            if ((ConstantExpression *)uVar9 != (ConstantExpression *)0x0) {
              (**(code **)(*(long *)uVar9 + 8))();
            }
            local_268 = (undefined1  [8])0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
            if (local_348._M_head_impl != (ParsedExpression *)0x0) {
              (*((local_348._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_348._M_head_impl = (ParsedExpression *)0x0;
            bVar18 = true;
            iVar19 = 4;
          }
          if (bVar10 == false) {
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(local_1c0);
            pcVar2 = (__return_storage_ptr__->error).final_message._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != local_1c8) {
              operator_delete(pcVar2);
            }
            pcVar2 = (__return_storage_ptr__->error).raw_message._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != local_1d0) {
              operator_delete(pcVar2);
            }
            _Var4._M_head_impl =
                 (__return_storage_ptr__->default_value).
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
            }
            (__return_storage_ptr__->default_value).
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)0x0;
            LogicalType::~LogicalType(&__return_storage_ptr__->new_type);
          }
        }
        if (iVar19 != 0) goto LAB_00a9c890;
        pLVar8 = pLVar13 + 1;
        pLVar13 = (LogicalType *)&pLVar13[2].type_info_;
      } while ((pointer)pLVar8 != ppVar17);
      iVar19 = 4;
LAB_00a9c890:
      bVar10 = iVar19 == 4;
    }
    if (!bVar10) goto LAB_00a9cb8b;
    local_c8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_338;
    local_c8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppStack_330;
    local_c8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_328;
    local_338 = (pointer)0x0;
    ppStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    LogicalType::STRUCT((LogicalType *)local_268,&local_c8);
    local_308._0_2_ = local_268._0_2_;
    LogicalType::~LogicalType((LogicalType *)local_268);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_c8);
    if (!bVar18) {
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      local_268 = (undefined1  [8])acStack_258;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"Sub-field %s does not exist in column %s","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (local_318->first)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (local_318->first)._M_string_length);
      pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](column_path,local_1d8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar2 = (pvVar12->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + pvVar12->_M_string_length);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (pBVar16,(string *)local_268,&local_70,&local_90);
      __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&__return_storage_ptr__->new_type,(LogicalType *)local_308);
    (__return_storage_ptr__->default_value).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)local_308._24_8_;
  }
  local_308._24_8_ = (ConstantExpression *)0x0;
  (__return_storage_ptr__->error).initialized = (bool)local_308[0x20];
  (__return_storage_ptr__->error).type = local_308[0x21];
  paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
  (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_2e0 == &local_2d0) {
    *(undefined4 *)paVar1 = local_2d0._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
         local_2d0._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
         local_2d0._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
         local_2d0._12_4_;
  }
  else {
    (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_2e0;
    (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
         CONCAT44(local_2d0._M_allocated_capacity._4_4_,local_2d0._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr__->error).raw_message._M_string_length = local_2d8;
  local_2d8 = 0;
  local_2d0._M_allocated_capacity._0_4_ = local_2d0._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
  (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_2c0 == &local_2b0) {
    *(undefined4 *)paVar1 = local_2b0._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
         local_2b0._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
         local_2b0._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
         local_2b0._12_4_;
  }
  else {
    (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_2c0;
    (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
         CONCAT44(local_2b0._M_allocated_capacity._4_4_,local_2b0._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr__->error).final_message._M_string_length = local_2b8;
  local_2b8 = 0;
  local_2b0._M_allocated_capacity._0_4_ = local_2b0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_2e0 = &local_2d0;
  local_2c0 = &local_2b0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(__return_storage_ptr__->error).extra_info,local_2a0);
LAB_00a9cb8b:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_338);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_2a0);
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if ((ConstantExpression *)local_308._24_8_ != (ConstantExpression *)0x0) {
    (**(code **)(*(long *)local_308._24_8_ + 8))();
  }
  local_308._24_8_ = 0;
  LogicalType::~LogicalType((LogicalType *)local_308);
  return __return_storage_ptr__;
}

Assistant:

StructMappingInfo AddFieldToStruct(const LogicalType &type, const vector<string> &column_path,
                                   const ColumnDefinition &new_field, idx_t depth = 0) {
	if (type.id() != LogicalTypeId::STRUCT) {
		throw BinderException("Column %s is not a struct - ALTER TABLE can only add fields to structs",
		                      column_path[depth]);
	}
	StructMappingInfo result;
	auto child_list = StructType::GetChildTypes(type);
	if (column_path.size() == depth + 1) {
		// root path - we are adding at this level
		// check if a field with this name already exists
		for (auto &entry : child_list) {
			if (StringUtil::CIEquals(entry.first, new_field.Name())) {
				// already exists!
				result.error = ErrorData(CatalogException("Duplicate field \"%s\" - field already exists in struct %s",
				                                          new_field.Name(), column_path.back()));
				return result;
			}
		}
		// add the new type
		child_list.emplace_back(new_field.Name(), new_field.Type());
		result.new_type = LogicalType::STRUCT(std::move(child_list));
		// set the default value
		unique_ptr<ParsedExpression> default_value;
		if (new_field.HasDefaultValue()) {
			default_value = new_field.DefaultValue().Copy();
		} else {
			default_value = make_uniq<ConstantExpression>(Value(new_field.Type()));
		}
		result.default_value = PackExpression(std::move(default_value), new_field.Name());
		return result;
	}
	// not the root path - we need to recurse
	auto &next_component = column_path[depth + 1];
	bool found = false;
	for (auto &entry : child_list) {
		if (StringUtil::CIEquals(entry.first, next_component)) {
			// found the entry - recurse
			auto child_res = AddFieldToStruct(entry.second, column_path, new_field, depth + 1);
			if (child_res.error.HasError()) {
				return child_res;
			}
			entry.second = std::move(child_res.new_type);
			result.default_value = PackExpression(std::move(child_res.default_value), entry.first);
			found = true;
			break;
		}
	}
	result.new_type = LogicalType::STRUCT(std::move(child_list));
	if (!found) {
		throw BinderException("Sub-field %s does not exist in column %s", next_component, column_path[depth]);
	}
	return result;
}